

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

bool __thiscall
icu_63::DecimalFormat::fastFormatDouble(DecimalFormat *this,double input,UnicodeString *output)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined4 extraout_EDX;
  undefined4 uVar3;
  double dVar4;
  undefined8 in_XMM0_Qb;
  
  bVar2 = false;
  if ((!NAN(input)) && (bVar2 = false, this->fields->canUseFastFormat != false)) {
    dVar4 = trunc(input);
    auVar1._8_8_ = in_XMM0_Qb;
    auVar1._0_8_ = input;
    bVar2 = false;
    if ((input <= 2147483647.0) && (-2147483648.0 < input)) {
      if ((dVar4 == input) && (!NAN(dVar4) && !NAN(input))) {
        uVar3 = movmskpd(extraout_EDX,auVar1);
        doFastFormatInt32(this,(int)input,(bool)((byte)uVar3 & 1),output);
        bVar2 = true;
      }
    }
  }
  return bVar2;
}

Assistant:

bool DecimalFormat::fastFormatDouble(double input, UnicodeString& output) const {
    if (!fields->canUseFastFormat) {
        return false;
    }
    if (std::isnan(input)
            || std::trunc(input) != input
            || input <= INT32_MIN
            || input > INT32_MAX) {
        return false;
    }
    doFastFormatInt32(static_cast<int32_t>(input), std::signbit(input), output);
    return true;
}